

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Color ColorFromNormalized(Vector4 normalized)

{
  Color CVar1;
  undefined4 local_1c;
  undefined4 uStack_18;
  Vector4 normalized_local;
  Color result;
  
  local_1c = normalized.x;
  uStack_18 = normalized.y;
  CVar1.g = (char)(int)(uStack_18 * 255.0);
  CVar1.r = (char)(int)(local_1c * 255.0);
  normalized_local.x = normalized.z;
  CVar1.b = (char)(int)(normalized_local.x * 255.0);
  normalized_local.y = normalized.w;
  CVar1.a = (uchar)(int)(normalized_local.y * 255.0);
  return CVar1;
}

Assistant:

Color ColorFromNormalized(Vector4 normalized)
{
    Color result;

    result.r = (unsigned char)(normalized.x*255.0f);
    result.g = (unsigned char)(normalized.y*255.0f);
    result.b = (unsigned char)(normalized.z*255.0f);
    result.a = (unsigned char)(normalized.w*255.0f);

    return result;
}